

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

void __thiscall despot::POMDPX::POMDPX(POMDPX *this,string *params_file)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  Parser *this_00;
  log_ostream *plVar5;
  ostream *poVar6;
  OBS_TYPE OVar7;
  void *pvVar8;
  reference pvVar9;
  reference pvVar10;
  ValuedAction VVar11;
  ValuedAction local_98;
  int local_84;
  value_type vStack_80;
  int s;
  double min_reward;
  ACT_TYPE AStack_70;
  int a;
  double dStack_68;
  ACT_TYPE local_60;
  undefined4 uStack_5c;
  double dStack_58;
  undefined1 local_49;
  string local_48;
  string *local_18;
  string *params_file_local;
  POMDPX *this_local;
  
  local_18 = params_file;
  params_file_local = (string *)this;
  MDP::MDP(&this->super_MDP);
  DSPOMDP::DSPOMDP(&this->super_DSPOMDP);
  StateIndexer::StateIndexer(&this->super_StateIndexer);
  StatePolicy::StatePolicy(&this->super_StatePolicy);
  (this->super_MDP)._vptr_MDP = (_func_int **)&PTR__POMDPX_0026eaa0;
  (this->super_DSPOMDP)._vptr_DSPOMDP = (_func_int **)&PTR__POMDPX_0026eba0;
  (this->super_StateIndexer)._vptr_StateIndexer = (_func_int **)&PTR__POMDPX_0026ec80;
  (this->super_StatePolicy)._vptr_StatePolicy = (_func_int **)&PTR__POMDPX_0026ecb8;
  ValuedAction::ValuedAction(&this->min_reward_action_);
  ValuedAction::ValuedAction(&this->max_reward_action_);
  std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::vector(&this->states_)
  ;
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::vector(&this->transition_probabilities_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->rewards_);
  MemoryPool<despot::POMDPXState>::MemoryPool(&this->memory_pool_);
  std::vector<int,_std::allocator<int>_>::vector(&this->default_action_);
  current_ = this;
  this_00 = (Parser *)operator_new(0x228);
  local_49 = 1;
  std::__cxx11::string::string((string *)&local_48,(string *)params_file);
  Parser::Parser(this_00,&local_48);
  local_49 = 0;
  this->parser_ = this_00;
  std::__cxx11::string::~string((string *)&local_48);
  VVar11 = Parser::ComputeMaxRewardAction(this->parser_);
  dStack_58 = VVar11.value;
  local_60 = VVar11.action;
  *(ulong *)&this->max_reward_action_ = CONCAT44(uStack_5c,local_60);
  (this->max_reward_action_).value = dStack_58;
  iVar3 = logging::level();
  if ((0 < iVar3) && (iVar3 = logging::level(), 2 < iVar3)) {
    plVar5 = logging::stream(3);
    poVar6 = std::operator<<(&plVar5->super_ostream,"Max reward action = ");
    poVar6 = despot::operator<<(poVar6,&this->max_reward_action_);
    std::operator<<(poVar6," ");
  }
  VVar11 = Parser::ComputeMinRewardAction(this->parser_);
  dStack_68 = VVar11.value;
  AStack_70 = VVar11.action;
  *(ulong *)&this->min_reward_action_ = CONCAT44(a,AStack_70);
  (this->min_reward_action_).value = dStack_68;
  iVar3 = logging::level();
  if ((0 < iVar3) && (iVar3 = logging::level(), 2 < iVar3)) {
    plVar5 = logging::stream(3);
    poVar6 = std::operator<<(&plVar5->super_ostream,"Min reward action = ");
    poVar6 = despot::operator<<(poVar6,&this->min_reward_action_);
    std::operator<<(poVar6," ");
  }
  iVar3 = logging::level();
  if ((0 < iVar3) && (iVar3 = logging::level(), 2 < iVar3)) {
    plVar5 = logging::stream(3);
    poVar6 = std::operator<<(&plVar5->super_ostream,"#State / log2(#State) = ");
    iVar3 = Parser::NumStates(this->parser_);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
    poVar6 = std::operator<<(poVar6," / ");
    dVar2 = Parser::LogNumStates(this->parser_);
    pvVar8 = (void *)std::ostream::operator<<(poVar6,dVar2);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  }
  iVar3 = logging::level();
  if ((0 < iVar3) && (iVar3 = logging::level(), 2 < iVar3)) {
    plVar5 = logging::stream(3);
    poVar6 = std::operator<<(&plVar5->super_ostream,"#InitState / log2(#InitState) = ");
    iVar3 = Parser::NumInitialStates(this->parser_);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
    poVar6 = std::operator<<(poVar6," / ");
    dVar2 = Parser::LogNumInitialStates(this->parser_);
    pvVar8 = (void *)std::ostream::operator<<(poVar6,dVar2);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  }
  iVar3 = logging::level();
  if ((0 < iVar3) && (iVar3 = logging::level(), 2 < iVar3)) {
    plVar5 = logging::stream(3);
    poVar6 = std::operator<<(&plVar5->super_ostream,"#Action = ");
    iVar3 = Parser::NumActions(this->parser_);
    pvVar8 = (void *)std::ostream::operator<<(poVar6,iVar3);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  }
  iVar3 = logging::level();
  if ((0 < iVar3) && (iVar3 = logging::level(), 2 < iVar3)) {
    plVar5 = logging::stream(3);
    poVar6 = std::operator<<(&plVar5->super_ostream,"#Obs / log2(#Obs) = ");
    OVar7 = Parser::NumObservations(this->parser_);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,OVar7);
    poVar6 = std::operator<<(poVar6," / ");
    dVar2 = Parser::LogNumObservations(this->parser_);
    pvVar8 = (void *)std::ostream::operator<<(poVar6,dVar2);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  }
  dVar2 = Parser::LogNumStates(this->parser_);
  this->is_small_ = dVar2 <= 15.0;
  if ((this->is_small_ & 1U) != 0) {
    InitStates(this);
    InitTransitions(this);
    InitRewards(this);
    for (min_reward._4_4_ = 0; iVar3 = min_reward._4_4_, iVar4 = (*(this->super_MDP)._vptr_MDP[3])()
        , iVar3 < iVar4; min_reward._4_4_ = min_reward._4_4_ + 1) {
      vStack_80 = INFINITY;
      for (local_84 = 0; iVar3 = local_84, iVar4 = (*(this->super_MDP)._vptr_MDP[2])(),
          iVar3 < iVar4; local_84 = local_84 + 1) {
        pvVar9 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->rewards_,(long)local_84);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (pvVar9,(long)min_reward._4_4_);
        if (*pvVar10 < vStack_80) {
          pvVar9 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&this->rewards_,(long)local_84);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (pvVar9,(long)min_reward._4_4_);
          vStack_80 = *pvVar10;
        }
      }
      pdVar1 = &(this->min_reward_action_).value;
      if (*pdVar1 <= vStack_80 && vStack_80 != *pdVar1) {
        ValuedAction::ValuedAction(&local_98,min_reward._4_4_,vStack_80);
        (this->min_reward_action_).action = local_98.action;
        *(undefined4 *)&(this->min_reward_action_).field_0x4 = local_98._4_4_;
        (this->min_reward_action_).value = local_98.value;
      }
    }
  }
  return;
}

Assistant:

POMDPX::POMDPX(string params_file) {
	current_ = this;
	parser_ = new Parser(params_file);

	max_reward_action_ = parser_->ComputeMaxRewardAction();
	logi << "Max reward action = " << max_reward_action_ << " ";
	min_reward_action_ = parser_->ComputeMinRewardAction();
	logi << "Min reward action = " << min_reward_action_ << " ";
	logi << "#State / log2(#State) = " << parser_->NumStates() << " / "
		<< parser_->LogNumStates() << endl;
	logi << "#InitState / log2(#InitState) = " << parser_->NumInitialStates()
		<< " / " << parser_->LogNumInitialStates() << endl;
	logi << "#Action = " << parser_->NumActions() << endl;
	logi << "#Obs / log2(#Obs) = " << parser_->NumObservations() << " / "
		<< parser_->LogNumObservations() << endl;

	is_small_ = (parser_->LogNumStates() <= 15);

	if (is_small_) {
		InitStates();
		InitTransitions();
		InitRewards(); // Must be called after initializing transitions

		for (int a = 0; a < NumActions(); a++) {
			double min_reward = Globals::POS_INFTY;

			for (int s = 0; s < NumStates(); s++) {
				if (rewards_[s][a] < min_reward) {
					min_reward = rewards_[s][a];
				}
			}

			if (min_reward > min_reward_action_.value) {
				min_reward_action_ = ValuedAction(a, min_reward);
			}
		}
	}
}